

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall c4::yml::Tree::resolve_tag(Tree *this,substr output,csubstr tag,size_t node_id)

{
  csubstr s;
  csubstr s_00;
  csubstr s_01;
  ro_substr pattern;
  ro_substr chars;
  ro_substr chars_00;
  error_flags eVar1;
  ulong in_RDX;
  char *in_RSI;
  long in_RDI;
  ulong in_R8;
  ulong in_R9;
  bool bVar2;
  char msg_11 [28];
  char msg_10 [33];
  char msg_9 [25];
  char msg_8 [28];
  char msg_7 [22];
  uint8_t val;
  char msg_6 [32];
  char msg_5 [27];
  size_t next_1;
  char msg_4 [28];
  anon_class_16_2_d8a679f5 appendchar;
  anon_class_16_2_d8a679f5 appendstr;
  size_t wpos;
  size_t prev;
  size_t delta;
  char msg_3 [32];
  char msg_2 [27];
  size_t next;
  char msg_1 [28];
  size_t pos;
  size_t numpc;
  size_t len;
  csubstr rest;
  char msg [41];
  TagDirective *td;
  size_t i;
  uchar cv;
  char c;
  iterator __end2;
  iterator __begin2;
  csubstr *__range2;
  undefined4 in_stack_fffffffffffff83c;
  undefined4 in_stack_fffffffffffff840;
  undefined4 in_stack_fffffffffffff844;
  undefined4 in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff84c;
  undefined4 in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff854;
  basic_substring<const_char> *in_stack_fffffffffffff858;
  Location *in_stack_fffffffffffff860;
  undefined7 in_stack_fffffffffffff868;
  undefined7 uVar3;
  char in_stack_fffffffffffff86f;
  undefined1 uVar4;
  basic_substring<const_char> *in_stack_fffffffffffff870;
  code *pcVar5;
  undefined7 in_stack_fffffffffffff878;
  undefined1 in_stack_fffffffffffff87f;
  char *in_stack_fffffffffffff880;
  size_t in_stack_fffffffffffff888;
  undefined1 *puVar6;
  size_t local_740;
  bool local_712;
  bool local_703;
  ulong local_700;
  char local_628 [40];
  undefined8 local_600;
  undefined8 local_5f8;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  basic_substring<const_char> *local_5d0;
  undefined1 local_5c8 [48];
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined4 local_590;
  undefined4 uStack_58c;
  undefined4 uStack_588;
  undefined4 uStack_584;
  basic_substring<const_char> *local_580;
  char local_578 [120];
  undefined8 local_500;
  undefined8 local_4f8;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  basic_substring<const_char> *local_4d0;
  char local_4c8 [32];
  char *local_4a8;
  long local_4a0;
  byte local_491 [5];
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  basic_substring<const_char> *local_470;
  char local_468 [44];
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  basic_substring<const_char> *local_420;
  char local_418 [32];
  basic_substring<char_const> local_3f8 [16];
  ulong local_3e8;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  basic_substring<const_char> *local_3c0;
  char local_3b8 [32];
  long local_398;
  long local_390;
  anon_class_16_2_d8a679f5 local_388;
  substr *local_378;
  size_t *local_370;
  size_t local_368;
  ulong local_360;
  long local_358;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined4 local_340;
  undefined4 uStack_33c;
  undefined4 uStack_338;
  undefined4 uStack_334;
  basic_substring<const_char> *local_330;
  char local_328 [44];
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  basic_substring<const_char> *in_stack_fffffffffffffd20;
  basic_substring<char_const> local_2b8 [16];
  ulong local_2a8;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  basic_substring<const_char> *local_280;
  char local_278 [32];
  size_t local_258;
  size_t local_250;
  ulong local_248;
  void *local_240;
  ulong local_238;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  basic_substring<const_char> *local_210;
  undefined1 local_208 [48];
  long local_1d8;
  long local_1d0;
  long *local_1c8;
  long local_1c0;
  ulong local_1b8;
  undefined1 local_1a8 [8];
  ulong local_1a0;
  substr local_198;
  long *local_180;
  char *local_178;
  undefined4 local_170;
  ulong local_168;
  void **local_160;
  undefined8 local_158;
  undefined8 local_150;
  char *local_148;
  undefined4 local_140;
  ulong local_138;
  undefined1 *local_130;
  void *local_128;
  ulong local_120;
  char local_112;
  char local_111;
  char *local_110;
  char *local_108;
  char **local_100;
  char *local_f8;
  undefined4 local_f0;
  byte *local_e8;
  char *local_e0;
  long local_d8;
  char local_c9;
  char **local_c8;
  char **local_c0;
  char **local_b8;
  char *local_b0;
  undefined4 local_a8;
  char *local_a0;
  undefined4 local_98;
  char *local_90;
  undefined4 local_88;
  size_t local_80;
  ulong local_78;
  void **local_70;
  undefined8 local_68;
  undefined8 local_60;
  char *local_58;
  undefined4 local_50;
  char *local_48;
  undefined4 local_40;
  char *local_38;
  undefined4 local_30;
  ulong local_28;
  ulong local_20;
  void **local_18;
  char *local_10;
  long local_8;
  
  local_1c0 = 3;
  local_1b8 = in_R9;
  local_1a0 = in_R8;
  local_198.str = in_RSI;
  local_198.len = in_RDX;
  do {
    if (local_1c0 == -1) {
      return 0;
    }
    local_1c8 = (long *)(in_RDI + 0x60 + local_1c0 * 0x28);
    bVar2 = true;
    if (local_1c8[1] != 0) {
      bVar2 = *local_1c8 == 0;
    }
    if (!bVar2) {
      local_1d8 = *local_1c8;
      local_1d0 = local_1c8[1];
      pattern.len._0_7_ = in_stack_fffffffffffff868;
      pattern.str = (char *)in_stack_fffffffffffff860;
      pattern.len._7_1_ = in_stack_fffffffffffff86f;
      local_180 = local_1c8;
      bVar2 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff858,pattern);
      if ((bVar2) && ((ulong)local_1c8[4] <= local_1b8)) {
        if (local_1a0 < (ulong)local_1c8[1]) {
          memcpy(local_208,"check failed: (tag.len >= td.handle.len)",0x29);
          eVar1 = get_error_flags();
          if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          pcVar5 = *(code **)(in_RDI + 0x58);
          Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                             CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                             CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
          (*pcVar5)(local_208,0x29,*(undefined8 *)(in_RDI + 0x40));
          in_stack_fffffffffffff83c = uStack_22c;
          in_stack_fffffffffffff840 = uStack_228;
          in_stack_fffffffffffff844 = uStack_224;
          in_stack_fffffffffffff848 = local_220;
          in_stack_fffffffffffff84c = uStack_21c;
          in_stack_fffffffffffff850 = uStack_218;
          in_stack_fffffffffffff854 = uStack_214;
          in_stack_fffffffffffff858 = local_210;
        }
        local_138 = local_1c8[1];
        local_130 = local_1a8;
        if (local_1a0 < local_138) {
          eVar1 = get_error_flags();
          if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_148 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_140 = 0x1533;
          handle_error(0x3fa1ef,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)in_stack_fffffffffffff860,
                   (char *)in_stack_fffffffffffff858,
                   CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
        local_240 = local_128;
        local_238 = local_120;
        local_248 = local_1c8[3] + local_120 + 2;
        local_250 = basic_substring<const_char>::count
                              (in_stack_fffffffffffff870,in_stack_fffffffffffff86f,
                               (size_t)in_stack_fffffffffffff860);
        if (local_250 == 0) {
          if (local_248 <= local_198.len) {
            *local_198.str = '<';
            memcpy(local_198.str + 1,(void *)local_1c8[2],local_1c8[3]);
            memcpy(local_198.str + local_1c8[3] + 1,local_240,local_238);
            local_198.str[local_1c8[3] + 1 + local_238] = '>';
          }
        }
        else {
          local_258 = basic_substring<const_char>::find
                                ((basic_substring<const_char> *)
                                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                                 (char)((uint)in_stack_fffffffffffff83c >> 0x18),0x3990a4);
          if (local_258 == 0xffffffffffffffff) {
            builtin_strncpy(local_278,"check failed: (pos != npos)",0x1c);
            eVar1 = get_error_flags();
            if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            pcVar5 = *(code **)(in_RDI + 0x58);
            Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                               CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                               CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
            (*pcVar5)(local_278,0x1c,*(undefined8 *)(in_RDI + 0x40));
            in_stack_fffffffffffff83c = uStack_29c;
            in_stack_fffffffffffff840 = uStack_298;
            in_stack_fffffffffffff844 = uStack_294;
            in_stack_fffffffffffff848 = local_290;
            in_stack_fffffffffffff84c = uStack_28c;
            in_stack_fffffffffffff850 = uStack_288;
            in_stack_fffffffffffff854 = uStack_284;
            in_stack_fffffffffffff858 = local_280;
          }
          do {
            basic_substring<char_const>::basic_substring<23ul>
                      (local_2b8,(char (*) [23])"0123456789abcdefABCDEF");
            chars.len = in_stack_fffffffffffff888;
            chars.str = in_stack_fffffffffffff880;
            local_2a8 = basic_substring<const_char>::first_not_of
                                  ((basic_substring<const_char> *)
                                   CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
                                   chars,(size_t)in_stack_fffffffffffff870);
            if (local_2a8 == 0xffffffffffffffff) {
              local_2a8 = local_238;
            }
            if (local_2a8 <= local_258 + 1) {
              eVar1 = get_error_flags();
              if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                trap_instruction();
              }
              pcVar5 = *(code **)(in_RDI + 0x58);
              Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                                 CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                                 CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
              in_stack_fffffffffffff858 = in_stack_fffffffffffffd20;
              in_stack_fffffffffffff83c = uStack_2fc;
              in_stack_fffffffffffff840 = uStack_2f8;
              in_stack_fffffffffffff844 = uStack_2f4;
              in_stack_fffffffffffff848 = local_2f0;
              in_stack_fffffffffffff84c = uStack_2ec;
              in_stack_fffffffffffff850 = uStack_2e8;
              in_stack_fffffffffffff854 = uStack_2e4;
              in_stack_fffffffffffffd20 = in_stack_fffffffffffff858;
              (*pcVar5)(&stack0xfffffffffffffd28,0x1b,*(undefined8 *)(in_RDI + 0x40));
            }
            if (local_2a8 < local_258 + 3) {
              builtin_strncpy(local_328,"check failed: pos+1 + 2 <= next",0x20);
              eVar1 = get_error_flags();
              if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                trap_instruction();
              }
              pcVar5 = *(code **)(in_RDI + 0x58);
              Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                                 CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                                 CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
              in_stack_fffffffffffff83c = uStack_34c;
              in_stack_fffffffffffff840 = uStack_348;
              in_stack_fffffffffffff844 = uStack_344;
              in_stack_fffffffffffff848 = local_340;
              in_stack_fffffffffffff84c = uStack_33c;
              in_stack_fffffffffffff850 = uStack_338;
              in_stack_fffffffffffff854 = uStack_334;
              in_stack_fffffffffffff858 = local_330;
              (*pcVar5)(local_328,0x20,*(undefined8 *)(in_RDI + 0x40));
            }
            local_358 = local_2a8 - (local_258 + 1);
            local_248 = local_248 - local_358;
            local_258 = basic_substring<const_char>::find
                                  ((basic_substring<const_char> *)
                                   CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                                   (char)((uint)in_stack_fffffffffffff83c >> 0x18),0x39947d);
          } while (local_258 != 0xffffffffffffffff);
          if (local_248 <= local_198.len) {
            local_360 = 0;
            local_368 = 0;
            local_378 = &local_198;
            local_370 = &local_368;
            local_388.output = &local_198;
            local_388.wpos = &local_368;
            resolve_tag::anon_class_16_2_d8a679f5::operator()(&local_388,'<');
            local_398 = local_1c8[2];
            local_390 = local_1c8[3];
            s.str._4_4_ = in_stack_fffffffffffff84c;
            s.str._0_4_ = in_stack_fffffffffffff848;
            s.len._0_4_ = in_stack_fffffffffffff850;
            s.len._4_4_ = in_stack_fffffffffffff854;
            resolve_tag::anon_class_16_2_d8a679f5::operator()
                      ((anon_class_16_2_d8a679f5 *)
                       CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),s);
            local_258 = basic_substring<const_char>::find
                                  ((basic_substring<const_char> *)
                                   CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                                   (char)((uint)in_stack_fffffffffffff83c >> 0x18),0x399567);
            if (local_258 == 0xffffffffffffffff) {
              builtin_strncpy(local_3b8,"check failed: (pos != npos)",0x1c);
              eVar1 = get_error_flags();
              if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                trap_instruction();
              }
              pcVar5 = *(code **)(in_RDI + 0x58);
              Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                                 CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                                 CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
              (*pcVar5)(local_3b8,0x1c,*(undefined8 *)(in_RDI + 0x40));
              in_stack_fffffffffffff83c = uStack_3dc;
              in_stack_fffffffffffff840 = uStack_3d8;
              in_stack_fffffffffffff844 = uStack_3d4;
              in_stack_fffffffffffff848 = local_3d0;
              in_stack_fffffffffffff84c = uStack_3cc;
              in_stack_fffffffffffff850 = uStack_3c8;
              in_stack_fffffffffffff854 = uStack_3c4;
              in_stack_fffffffffffff858 = local_3c0;
            }
            do {
              basic_substring<char_const>::basic_substring<23ul>
                        (local_3f8,(char (*) [23])"0123456789abcdefABCDEF");
              chars_00.len = in_stack_fffffffffffff888;
              chars_00.str = in_stack_fffffffffffff880;
              local_3e8 = basic_substring<const_char>::first_not_of
                                    ((basic_substring<const_char> *)
                                     CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
                                     chars_00,(size_t)in_stack_fffffffffffff870);
              if (local_3e8 == 0xffffffffffffffff) {
                local_3e8 = local_238;
              }
              if (local_3e8 <= local_258 + 1) {
                builtin_strncpy(local_418,"check failed: pos+1 < next",0x1b);
                eVar1 = get_error_flags();
                if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                  trap_instruction();
                }
                pcVar5 = *(code **)(in_RDI + 0x58);
                Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                                   CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                                   CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                                   CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
                in_stack_fffffffffffff83c = uStack_43c;
                in_stack_fffffffffffff840 = uStack_438;
                in_stack_fffffffffffff844 = uStack_434;
                in_stack_fffffffffffff848 = local_430;
                in_stack_fffffffffffff84c = uStack_42c;
                in_stack_fffffffffffff850 = uStack_428;
                in_stack_fffffffffffff854 = uStack_424;
                in_stack_fffffffffffff858 = local_420;
                (*pcVar5)(local_418,0x1b,*(undefined8 *)(in_RDI + 0x40));
              }
              if (local_3e8 < local_258 + 3) {
                builtin_strncpy(local_468,"check failed: pos+1 + 2 <= next",0x20);
                eVar1 = get_error_flags();
                if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                  trap_instruction();
                }
                pcVar5 = *(code **)(in_RDI + 0x58);
                Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                                   CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                                   CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                                   CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
                in_stack_fffffffffffff83c = uStack_48c;
                in_stack_fffffffffffff840 = uStack_488;
                in_stack_fffffffffffff844 = uStack_484;
                in_stack_fffffffffffff848 = local_480;
                in_stack_fffffffffffff84c = uStack_47c;
                in_stack_fffffffffffff850 = uStack_478;
                in_stack_fffffffffffff854 = uStack_474;
                in_stack_fffffffffffff858 = local_470;
                (*pcVar5)(local_468,0x20,*(undefined8 *)(in_RDI + 0x40));
              }
              local_20 = local_258 + 1;
              local_18 = &local_240;
              local_28 = local_3e8;
              if (local_238 < local_20) {
                eVar1 = get_error_flags();
                if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                  trap_instruction();
                }
                local_38 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_30 = 0x1544;
                handle_error(0x3fa1ef,(char *)0x1544,"check failed: %s","first >= 0 && first <= len"
                            );
              }
              if (local_28 == 0xffffffffffffffff) {
                local_700 = local_238;
              }
              else {
                local_700 = local_28;
              }
              local_28 = local_700;
              if (local_700 < local_20) {
                eVar1 = get_error_flags();
                if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                  trap_instruction();
                }
                local_48 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_40 = 0x1546;
                handle_error(0x3fa1ef,(char *)0x1546,"check failed: %s","first <= last");
              }
              if (local_238 < local_28) {
                eVar1 = get_error_flags();
                if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                  trap_instruction();
                }
                local_58 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_50 = 0x1547;
                handle_error(0x3fa1ef,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
              }
              basic_substring<const_char>::basic_substring
                        ((basic_substring<const_char> *)in_stack_fffffffffffff860,
                         (char *)in_stack_fffffffffffff858,
                         CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
              local_4a8 = local_10;
              local_4a0 = local_8;
              local_e0 = local_10;
              local_d8 = local_8;
              local_e8 = local_491;
              local_b8 = &local_e0;
              local_703 = local_8 == 0 || local_10 == (char *)0x0;
              if (local_703) {
                eVar1 = get_error_flags();
                if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                  trap_instruction();
                }
                local_f8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_f0 = 0x2cac;
                handle_error(0x3fa1ef,(char *)0x2cac,"check failed: %s","!s.empty()");
              }
              *local_e8 = 0;
              local_100 = &local_e0;
              local_110 = local_e0 + local_d8;
              local_c8 = local_100;
              local_c0 = local_100;
              for (local_108 = local_e0; local_108 != local_110; local_108 = local_108 + 1) {
                local_111 = *local_108;
                if ((local_111 < '0') || ('9' < local_111)) {
                  if ((local_111 < 'a') || ('f' < local_111)) {
                    if ((local_111 < 'A') || ('F' < local_111)) {
                      local_c9 = '\0';
                      goto LAB_00399dd4;
                    }
                    local_112 = local_111 + -0x37;
                  }
                  else {
                    local_112 = local_111 + -0x57;
                  }
                }
                else {
                  local_112 = local_111 + -0x30;
                }
                *local_e8 = *local_e8 * '\x10' + local_112;
              }
              local_c9 = '\x01';
LAB_00399dd4:
              local_712 = local_c9 == '\0' || 0x7f < local_491[0];
              if (local_712) {
                builtin_strncpy(local_4c8,"invalid URI character",0x16);
                eVar1 = get_error_flags();
                if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                  trap_instruction();
                }
                pcVar5 = *(code **)(in_RDI + 0x58);
                Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                                   CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                                   CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                                   CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
                in_stack_fffffffffffff83c = uStack_4ec;
                in_stack_fffffffffffff840 = uStack_4e8;
                in_stack_fffffffffffff844 = uStack_4e4;
                in_stack_fffffffffffff848 = local_4e0;
                in_stack_fffffffffffff84c = uStack_4dc;
                in_stack_fffffffffffff850 = uStack_4d8;
                in_stack_fffffffffffff854 = uStack_4d4;
                in_stack_fffffffffffff858 = local_4d0;
                (*pcVar5)(local_4c8,0x16,*(undefined8 *)(in_RDI + 0x40));
              }
              local_70 = &local_240;
              local_78 = local_360;
              local_80 = local_258;
              if (local_238 < local_360) {
                eVar1 = get_error_flags();
                if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                  trap_instruction();
                }
                local_90 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_88 = 0x1544;
                handle_error(0x3fa1ef,(char *)0x1544,"check failed: %s","first >= 0 && first <= len"
                            );
              }
              if (local_80 == 0xffffffffffffffff) {
                local_740 = local_238;
              }
              else {
                local_740 = local_80;
              }
              local_80 = local_740;
              if (local_740 < local_78) {
                eVar1 = get_error_flags();
                if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                  trap_instruction();
                }
                local_a0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_98 = 0x1546;
                handle_error(0x3fa1ef,(char *)0x1546,"check failed: %s","first <= last");
              }
              if (local_238 < local_80) {
                eVar1 = get_error_flags();
                if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                  trap_instruction();
                }
                local_b0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_a8 = 0x1547;
                handle_error(0x3fa1ef,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
              }
              basic_substring<const_char>::basic_substring
                        ((basic_substring<const_char> *)in_stack_fffffffffffff860,
                         (char *)in_stack_fffffffffffff858,
                         CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
              local_500 = local_68;
              local_4f8 = local_60;
              s_00.str._4_4_ = in_stack_fffffffffffff84c;
              s_00.str._0_4_ = in_stack_fffffffffffff848;
              s_00.len._0_4_ = in_stack_fffffffffffff850;
              s_00.len._4_4_ = in_stack_fffffffffffff854;
              resolve_tag::anon_class_16_2_d8a679f5::operator()
                        ((anon_class_16_2_d8a679f5 *)
                         CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),s_00);
              resolve_tag::anon_class_16_2_d8a679f5::operator()(&local_388,local_491[0]);
              local_360 = local_3e8;
              local_258 = basic_substring<const_char>::find
                                    ((basic_substring<const_char> *)
                                     CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                                     (char)((uint)in_stack_fffffffffffff83c >> 0x18),0x39a1d6);
            } while (local_258 != 0xffffffffffffffff);
            if (local_360 == 0) {
              builtin_strncpy(local_578,"check failed: (prev > 0)",0x19);
              eVar1 = get_error_flags();
              if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                trap_instruction();
              }
              pcVar5 = *(code **)(in_RDI + 0x58);
              Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                                 CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                                 CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
              (*pcVar5)(local_578,0x19,*(undefined8 *)(in_RDI + 0x40));
              in_stack_fffffffffffff840 = uStack_598;
              in_stack_fffffffffffff844 = uStack_594;
              in_stack_fffffffffffff848 = local_590;
              in_stack_fffffffffffff84c = uStack_58c;
              in_stack_fffffffffffff850 = uStack_588;
              in_stack_fffffffffffff854 = uStack_584;
              in_stack_fffffffffffff858 = local_580;
            }
            if (local_238 < local_360) {
              memcpy(local_5c8,"check failed: (rest.len >= prev)",0x21);
              eVar1 = get_error_flags();
              if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                trap_instruction();
              }
              pcVar5 = *(code **)(in_RDI + 0x58);
              puVar6 = local_5c8;
              Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                                 CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                                 CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
              (*pcVar5)(puVar6,0x21,*(undefined8 *)(in_RDI + 0x40));
              in_stack_fffffffffffff840 = uStack_5e8;
              in_stack_fffffffffffff844 = uStack_5e4;
              in_stack_fffffffffffff848 = local_5e0;
              in_stack_fffffffffffff84c = uStack_5dc;
              in_stack_fffffffffffff850 = uStack_5d8;
              in_stack_fffffffffffff854 = uStack_5d4;
              in_stack_fffffffffffff858 = local_5d0;
            }
            local_160 = &local_240;
            local_168 = local_360;
            if (local_238 < local_360) {
              eVar1 = get_error_flags();
              if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                trap_instruction();
              }
              local_178 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_170 = 0x1533;
              handle_error(0x3fa1ef,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
            }
            basic_substring<const_char>::basic_substring
                      ((basic_substring<const_char> *)in_stack_fffffffffffff860,
                       (char *)in_stack_fffffffffffff858,
                       CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
            local_600 = local_158;
            local_5f8 = local_150;
            s_01.str._4_4_ = in_stack_fffffffffffff84c;
            s_01.str._0_4_ = in_stack_fffffffffffff848;
            s_01.len._0_4_ = in_stack_fffffffffffff850;
            s_01.len._4_4_ = in_stack_fffffffffffff854;
            resolve_tag::anon_class_16_2_d8a679f5::operator()
                      ((anon_class_16_2_d8a679f5 *)
                       CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),s_01);
            resolve_tag::anon_class_16_2_d8a679f5::operator()(&local_388,'>');
            if (local_368 != local_248) {
              builtin_strncpy(local_628,"check failed: (wpos == len)",0x1c);
              eVar1 = get_error_flags();
              if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                trap_instruction();
              }
              pcVar5 = *(code **)(in_RDI + 0x58);
              uVar3 = SUB87(local_628,0);
              uVar4 = (undefined1)((ulong)local_628 >> 0x38);
              Location::Location(in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                                 CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                                 CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
              (*pcVar5)(CONCAT17(uVar4,uVar3),0x1c,*(undefined8 *)(in_RDI + 0x40));
            }
          }
        }
        return local_248;
      }
    }
    local_1c0 = local_1c0 + -1;
  } while( true );
}

Assistant:

size_t Tree::resolve_tag(substr output, csubstr tag, size_t node_id) const
{
    // lookup from the end. We want to find the first directive that
    // matches the tag and has a target node id leq than the given
    // node_id.
    for(size_t i = RYML_MAX_TAG_DIRECTIVES-1; i != (size_t)-1; --i)
    {
        auto const& td = m_tag_directives[i];
        if(td.handle.empty())
            continue;
        if(tag.begins_with(td.handle) && td.next_node_id <= node_id)
        {
            _RYML_CB_ASSERT(m_callbacks, tag.len >= td.handle.len);
            csubstr rest = tag.sub(td.handle.len);
            size_t len = 1u + td.prefix.len + rest.len + 1u;
            size_t numpc = rest.count('%');
            if(numpc == 0)
            {
                if(len <= output.len)
                {
                    output.str[0] = '<';
                    memcpy(1u + output.str, td.prefix.str, td.prefix.len);
                    memcpy(1u + output.str + td.prefix.len, rest.str, rest.len);
                    output.str[1u + td.prefix.len + rest.len] = '>';
                }
            }
            else
            {
                // need to decode URI % sequences
                size_t pos = rest.find('%');
                _RYML_CB_ASSERT(m_callbacks, pos != npos);
                do {
                    size_t next = rest.first_not_of("0123456789abcdefABCDEF", pos+1);
                    if(next == npos)
                        next = rest.len;
                    _RYML_CB_CHECK(m_callbacks, pos+1 < next);
                    _RYML_CB_CHECK(m_callbacks, pos+1 + 2 <= next);
                    size_t delta = next - (pos+1);
                    len -= delta;
                    pos = rest.find('%', pos+1);
                } while(pos != npos);
                if(len <= output.len)
                {
                    size_t prev = 0, wpos = 0;
                    auto appendstr = [&](csubstr s) { memcpy(output.str + wpos, s.str, s.len); wpos += s.len; };
                    auto appendchar = [&](char c) { output.str[wpos++] = c; };
                    appendchar('<');
                    appendstr(td.prefix);
                    pos = rest.find('%');
                    _RYML_CB_ASSERT(m_callbacks, pos != npos);
                    do {
                        size_t next = rest.first_not_of("0123456789abcdefABCDEF", pos+1);
                        if(next == npos)
                            next = rest.len;
                        _RYML_CB_CHECK(m_callbacks, pos+1 < next);
                        _RYML_CB_CHECK(m_callbacks, pos+1 + 2 <= next);
                        uint8_t val;
                        if(C4_UNLIKELY(!read_hex(rest.range(pos+1, next), &val) || val > 127))
                            _RYML_CB_ERR(m_callbacks, "invalid URI character");
                        appendstr(rest.range(prev, pos));
                        appendchar((char)val);
                        prev = next;
                        pos = rest.find('%', pos+1);
                    } while(pos != npos);
                    _RYML_CB_ASSERT(m_callbacks, pos == npos);
                    _RYML_CB_ASSERT(m_callbacks, prev > 0);
                    _RYML_CB_ASSERT(m_callbacks, rest.len >= prev);
                    appendstr(rest.sub(prev));
                    appendchar('>');
                    _RYML_CB_ASSERT(m_callbacks, wpos == len);
                }
            }
            return len;
        }
    }
    return 0; // return 0 to signal that the tag is local and cannot be resolved
}